

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlDtdPtr xmlCreateIntSubset(xmlDocPtr doc,xmlChar *name,xmlChar *ExternalID,xmlChar *SystemID)

{
  _xmlNode *p_Var1;
  xmlDtdPtr pxVar2;
  xmlChar *pxVar3;
  _xmlNode **pp_Var4;
  xmlRegisterNodeFunc *pp_Var5;
  _xmlNode *p_Var6;
  _xmlNode **pp_Var7;
  
  if ((doc != (xmlDocPtr)0x0) && (pxVar2 = xmlGetIntSubset(doc), pxVar2 != (xmlDtdPtr)0x0)) {
    return pxVar2;
  }
  pxVar2 = (xmlDtdPtr)(*xmlMalloc)(0x80);
  if (pxVar2 == (xmlDtdPtr)0x0) {
    return (xmlDtdPtr)0x0;
  }
  pxVar2->_private = (void *)0x0;
  *(undefined8 *)&pxVar2->type = 0;
  pxVar2->SystemID = (xmlChar *)0x0;
  pxVar2->pentities = (void *)0x0;
  pxVar2->entities = (void *)0x0;
  pxVar2->ExternalID = (xmlChar *)0x0;
  pxVar2->elements = (void *)0x0;
  pxVar2->attributes = (void *)0x0;
  pxVar2->doc = (_xmlDoc *)0x0;
  pxVar2->notations = (void *)0x0;
  pxVar2->next = (_xmlNode *)0x0;
  pxVar2->prev = (_xmlNode *)0x0;
  pxVar2->last = (_xmlNode *)0x0;
  pxVar2->parent = (_xmlDoc *)0x0;
  pxVar2->name = (xmlChar *)0x0;
  pxVar2->children = (_xmlNode *)0x0;
  pxVar2->type = XML_DTD_NODE;
  if (name != (xmlChar *)0x0) {
    pxVar3 = xmlStrdup(name);
    pxVar2->name = pxVar3;
    if (pxVar3 == (xmlChar *)0x0) goto LAB_00145e23;
  }
  if (ExternalID != (xmlChar *)0x0) {
    pxVar3 = xmlStrdup(ExternalID);
    pxVar2->ExternalID = pxVar3;
    if (pxVar3 == (xmlChar *)0x0) goto LAB_00145e23;
  }
  if (SystemID != (xmlChar *)0x0) {
    pxVar3 = xmlStrdup(SystemID);
    pxVar2->SystemID = pxVar3;
    if (pxVar3 == (xmlChar *)0x0) {
LAB_00145e23:
      xmlFreeDtd(pxVar2);
      return (xmlDtdPtr)0x0;
    }
  }
  if (doc == (xmlDocPtr)0x0) goto LAB_00145e82;
  doc->intSubset = pxVar2;
  pxVar2->parent = doc;
  pxVar2->doc = doc;
  p_Var6 = doc->children;
  if (p_Var6 == (_xmlNode *)0x0) {
    doc->children = (_xmlNode *)pxVar2;
LAB_00145e59:
    pp_Var4 = &doc->last;
  }
  else {
    if (doc->type != XML_HTML_DOCUMENT_NODE) {
      for (; p_Var6 != (_xmlNode *)0x0; p_Var6 = p_Var6->next) {
        if (p_Var6->type == XML_ELEMENT_NODE) {
          pxVar2->next = p_Var6;
          p_Var1 = p_Var6->prev;
          pp_Var4 = &p_Var6->prev;
          pxVar2->prev = p_Var1;
          pp_Var7 = &p_Var1->next;
          if (p_Var1 == (_xmlNode *)0x0) {
            pp_Var7 = &doc->children;
          }
          *pp_Var7 = (_xmlNode *)pxVar2;
          goto LAB_00145e7f;
        }
      }
      p_Var6 = doc->last;
      pxVar2->prev = p_Var6;
      p_Var6->next = (_xmlNode *)pxVar2;
      pxVar2->next = (_xmlNode *)0x0;
      goto LAB_00145e59;
    }
    p_Var6->prev = (_xmlNode *)pxVar2;
    pxVar2->next = p_Var6;
    pp_Var4 = &doc->children;
  }
LAB_00145e7f:
  *pp_Var4 = (_xmlNode *)pxVar2;
LAB_00145e82:
  if (xmlRegisterCallbacks == 0) {
    return pxVar2;
  }
  pp_Var5 = __xmlRegisterNodeDefaultValue();
  if (*pp_Var5 != (xmlRegisterNodeFunc)0x0) {
    pp_Var5 = __xmlRegisterNodeDefaultValue();
    (**pp_Var5)((xmlNodePtr)pxVar2);
    return pxVar2;
  }
  return pxVar2;
}

Assistant:

xmlDtdPtr
xmlCreateIntSubset(xmlDocPtr doc, const xmlChar *name,
                   const xmlChar *ExternalID, const xmlChar *SystemID) {
    xmlDtdPtr cur;

    if (doc != NULL) {
        cur = xmlGetIntSubset(doc);
        if (cur != NULL)
            return(cur);
    }

    /*
     * Allocate a new DTD and fill the fields.
     */
    cur = (xmlDtdPtr) xmlMalloc(sizeof(xmlDtd));
    if (cur == NULL)
	return(NULL);
    memset(cur, 0, sizeof(xmlDtd));
    cur->type = XML_DTD_NODE;

    if (name != NULL) {
	cur->name = xmlStrdup(name);
	if (cur->name == NULL)
            goto error;
    }
    if (ExternalID != NULL) {
	cur->ExternalID = xmlStrdup(ExternalID);
	if (cur->ExternalID  == NULL)
            goto error;
    }
    if (SystemID != NULL) {
	cur->SystemID = xmlStrdup(SystemID);
	if (cur->SystemID == NULL)
            goto error;
    }
    if (doc != NULL) {
	doc->intSubset = cur;
	cur->parent = doc;
	cur->doc = doc;
	if (doc->children == NULL) {
	    doc->children = (xmlNodePtr) cur;
	    doc->last = (xmlNodePtr) cur;
	} else {
	    if (doc->type == XML_HTML_DOCUMENT_NODE) {
		xmlNodePtr prev;

		prev = doc->children;
		prev->prev = (xmlNodePtr) cur;
		cur->next = prev;
		doc->children = (xmlNodePtr) cur;
	    } else {
		xmlNodePtr next;

		next = doc->children;
		while ((next != NULL) && (next->type != XML_ELEMENT_NODE))
		    next = next->next;
		if (next == NULL) {
		    cur->prev = doc->last;
		    cur->prev->next = (xmlNodePtr) cur;
		    cur->next = NULL;
		    doc->last = (xmlNodePtr) cur;
		} else {
		    cur->next = next;
		    cur->prev = next->prev;
		    if (cur->prev == NULL)
			doc->children = (xmlNodePtr) cur;
		    else
			cur->prev->next = (xmlNodePtr) cur;
		    next->prev = (xmlNodePtr) cur;
		}
	    }
	}
    }

    if ((xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue((xmlNodePtr)cur);
    return(cur);

error:
    xmlFreeDtd(cur);
    return(NULL);
}